

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Comparison.cpp
# Opt level: O1

bool CoreML::Specification::operator==(TreeEnsembleClassifier *a,TreeEnsembleClassifier *b)

{
  uint32_t uVar1;
  uint32_t uVar2;
  bool bVar3;
  undefined1 *puVar4;
  undefined1 *puVar5;
  
  puVar5 = (undefined1 *)a->treeensemble_;
  if ((TreeEnsembleParameters *)puVar5 == (TreeEnsembleParameters *)0x0) {
    puVar5 = _TreeEnsembleParameters_default_instance_;
  }
  puVar4 = (undefined1 *)b->treeensemble_;
  if ((TreeEnsembleParameters *)puVar4 == (TreeEnsembleParameters *)0x0) {
    puVar4 = _TreeEnsembleParameters_default_instance_;
  }
  bVar3 = operator==((TreeEnsembleParameters *)puVar5,(TreeEnsembleParameters *)puVar4);
  if ((bVar3) && (a->postevaluationtransform_ == b->postevaluationtransform_)) {
    uVar1 = a->_oneof_case_[0];
    uVar2 = b->_oneof_case_[0];
    if (uVar1 == uVar2) {
      if (uVar1 == 100) {
        puVar4 = _StringVector_default_instance_;
        puVar5 = _StringVector_default_instance_;
        if (uVar1 == 100) {
          puVar5 = (undefined1 *)(a->ClassLabels_).stringclasslabels_;
        }
        if (uVar2 == 100) {
          puVar4 = (undefined1 *)(b->ClassLabels_).stringclasslabels_;
        }
        bVar3 = vectorsEqual<CoreML::Specification::StringVector>
                          ((StringVector *)puVar5,(StringVector *)puVar4);
        return bVar3;
      }
      if (uVar1 != 0x65) {
        return true;
      }
      puVar4 = _Int64Vector_default_instance_;
      puVar5 = _Int64Vector_default_instance_;
      if (uVar1 == 0x65) {
        puVar5 = (undefined1 *)(a->ClassLabels_).int64classlabels_;
      }
      if (uVar2 == 0x65) {
        puVar4 = (undefined1 *)(b->ClassLabels_).int64classlabels_;
      }
      bVar3 = vectorsEqual<CoreML::Specification::Int64Vector>
                        ((Int64Vector *)puVar5,(Int64Vector *)puVar4);
      return bVar3;
    }
  }
  return false;
}

Assistant:

bool operator==(const TreeEnsembleClassifier& a,
                        const TreeEnsembleClassifier& b) {
            if (a.treeensemble() != b.treeensemble()) {
                return false;
            }
            if (a.postevaluationtransform() != b.postevaluationtransform()) {
                return false;
            }
            if (a.ClassLabels_case() != b.ClassLabels_case()) {
                return false;
            }
            switch (a.ClassLabels_case()) {
                case TreeEnsembleClassifier::kInt64ClassLabels:
                    return a.int64classlabels() == b.int64classlabels();
                case TreeEnsembleClassifier::kStringClassLabels:
                    return a.stringclasslabels() == b.stringclasslabels();
                case TreeEnsembleClassifier::CLASSLABELS_NOT_SET:
                    return true;
            }
            return true;
        }